

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O3

void __thiscall FrameProtector::FrameProtector(FrameProtector *this,char *name)

{
  Frame *pFVar1;
  
  pFVar1 = g_current_frame;
  if (g_frames == (Frame *)0x0) {
    __assert_fail("g_frames != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0x57,"FrameProtector::FrameProtector(const char *)");
  }
  if (g_current_frame != (Frame *)0x0) {
    g_current_frame = (Frame *)operator_new(0x40);
    g_current_frame->name = name;
    (g_current_frame->roots).
    super__Vector_base<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (g_current_frame->roots).
    super__Vector_base<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (g_current_frame->roots).
    super__Vector_base<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (g_current_frame->vector_roots).
    super__Vector_base<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (g_current_frame->vector_roots).
    super__Vector_base<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (g_current_frame->vector_roots).
    super__Vector_base<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>,_std::allocator<std::tuple<const_char_*,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    g_current_frame->parent = pFVar1;
    this->protected_frame = g_current_frame;
    return;
  }
  __assert_fail("g_current_frame != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h",
                0x58,"FrameProtector::FrameProtector(const char *)");
}

Assistant:

FrameProtector(const char *name) {
    assert(g_frames != nullptr);
    assert(g_current_frame != nullptr);
    Frame *frame = new Frame(name, g_current_frame);
    g_current_frame = frame;
    protected_frame = frame;
  }